

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O0

void __thiscall
NfcFilter::process4(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  anon_class_72_13_27a1e4d5 __unary_op;
  const_iterator pfVar1;
  const_iterator pfVar2;
  undefined8 in_RCX;
  float *in_RDI;
  anon_class_72_13_27a1e4d5 proc_sample;
  float z4;
  float z3;
  float z2;
  float z1;
  float a4;
  float a3;
  float a2;
  float a1;
  float b4;
  float b3;
  float b2;
  float b1;
  float gain;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 local_e8 [8];
  float *pfStack_e0;
  float *local_d8;
  float *pfStack_d0;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  undefined8 local_20;
  span<const_float,_18446744073709551615UL> local_10;
  
  local_a0 = in_RDI[0x19];
  local_9c = in_RDI[0x1a];
  local_98 = in_RDI[0x1b];
  local_94 = in_RDI[0x1c];
  local_90 = in_RDI[0x1d];
  local_8c = in_RDI[0x1e];
  local_88 = in_RDI[0x1f];
  local_84 = in_RDI[0x20];
  local_80 = in_RDI[0x21];
  local_48 = in_RDI[0x22];
  local_4c = in_RDI[0x23];
  local_50 = in_RDI[0x24];
  local_54 = in_RDI[0x25];
  local_78 = &local_48;
  local_70 = &local_4c;
  local_68 = &local_50;
  local_60 = &local_54;
  local_44 = local_80;
  local_40 = local_84;
  local_3c = local_88;
  local_38 = local_8c;
  local_34 = local_90;
  local_30 = local_94;
  local_2c = local_98;
  local_28 = local_9c;
  local_24 = local_a0;
  local_20 = in_RCX;
  pfVar1 = al::span<const_float,_18446744073709551615UL>::cbegin(&local_10);
  pfVar2 = al::span<const_float,_18446744073709551615UL>::cend(&local_10);
  memcpy(local_e8,&local_a0,0x48);
  __unary_op.b2 = (float)(undefined4)local_b8;
  __unary_op.b3 = (float)local_b8._4_4_;
  __unary_op.gain = (float)(undefined4)uStack_c0;
  __unary_op.b1 = (float)uStack_c0._4_4_;
  __unary_op.b4 = (float)(undefined4)uStack_b0;
  __unary_op.a1 = (float)uStack_b0._4_4_;
  __unary_op.a2 = (float)(undefined4)local_a8;
  __unary_op.a3 = (float)local_a8._4_4_;
  __unary_op._32_8_ = in_stack_fffffffffffffef0;
  __unary_op.z1 = pfVar1;
  __unary_op.z2 = pfVar2;
  __unary_op.z3 = (float *)local_20;
  __unary_op.z4 = in_RDI;
  std::
  transform<float_const*,float*,NfcFilter::process4(al::span<float_const,18446744073709551615ul>,float*)::__0>
            (pfStack_d0,local_d8,pfStack_e0,__unary_op);
  in_RDI[0x22] = local_48;
  in_RDI[0x23] = local_4c;
  in_RDI[0x24] = local_50;
  in_RDI[0x25] = local_54;
  return;
}

Assistant:

void NfcFilter::process4(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{fourth.gain};
    const float b1{fourth.b1};
    const float b2{fourth.b2};
    const float b3{fourth.b3};
    const float b4{fourth.b4};
    const float a1{fourth.a1};
    const float a2{fourth.a2};
    const float a3{fourth.a3};
    const float a4{fourth.a4};
    float z1{fourth.z[0]};
    float z2{fourth.z[1]};
    float z3{fourth.z[2]};
    float z4{fourth.z[3]};
    auto proc_sample = [gain,b1,b2,b3,b4,a1,a2,a3,a4,&z1,&z2,&z3,&z4](const float in) noexcept -> float
    {
        float y{in*gain - a1*z1 - a2*z2};
        float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;

        y = out - a3*z3 - a4*z4;
        out = y + b3*z3 + b4*z4;
        z4 += z3;
        z3 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    fourth.z[0] = z1;
    fourth.z[1] = z2;
    fourth.z[2] = z3;
    fourth.z[3] = z4;
}